

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O1

void __thiscall Application::queryMarketDataRequest(Application *this)

{
  undefined1 *puVar1;
  int iVar2;
  long *plVar3;
  Message md;
  MarketDataRequest local_2c0;
  Message local_168 [344];
  
  iVar2 = queryVersion(this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nMarketDataRequest\n",0x13);
  FIX::Message::Message(local_168);
  if (iVar2 == 0x32) {
    queryMarketDataRequest50((MarketDataRequest *)&local_2c0,this);
    FIX::Message::operator=(local_168,(Message *)&local_2c0);
  }
  else if (iVar2 == 0x2c) {
    queryMarketDataRequest44((MarketDataRequest *)&local_2c0,this);
    FIX::Message::operator=(local_168,(Message *)&local_2c0);
  }
  else {
    if (iVar2 != 0x2b) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"No test for version ",0x14);
      plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
      std::ostream::put((char)plVar3);
      std::ostream::flush();
      goto LAB_0012054d;
    }
    queryMarketDataRequest43(&local_2c0,this);
    FIX::Message::operator=(local_168,(Message *)&local_2c0);
  }
  FIX::Message::~Message((Message *)&local_2c0);
LAB_0012054d:
  puVar1 = &local_2c0.super_Message.field_0x10;
  local_2c0.super_Message._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"");
  FIX::Session::sendToTarget(local_168,(string *)&local_2c0);
  if ((undefined1 *)local_2c0.super_Message._0_8_ != puVar1) {
    operator_delete((void *)local_2c0.super_Message._0_8_,local_2c0.super_Message._16_8_ + 1);
  }
  FIX::Message::~Message(local_168);
  return;
}

Assistant:

void Application::queryMarketDataRequest() {
  int version = queryVersion();
  std::cout << "\nMarketDataRequest\n";
  FIX::Message md;

  switch (version) {
  case 43:
    md = queryMarketDataRequest43();
    break;
  case 44:
    md = queryMarketDataRequest44();
    break;
  case 50:
    md = queryMarketDataRequest50();
    break;
  default:
    std::cerr << "No test for version " << version << std::endl;
    break;
  }

  FIX::Session::sendToTarget(md);
}